

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hal_task.cpp
# Opt level: O3

void * hal_task_hnd_get_data(HalTaskHnd hnd)

{
  void *pvVar1;
  
  if (hnd == (HalTaskHnd)0x0) {
    pvVar1 = (void *)0x0;
    _mpp_log_l(2,"hal_task","found invaid input hnd %p\n","hal_task_hnd_get_data",0);
  }
  else {
    if (*(int *)(*(long *)((long)hnd + 0x10) + 4) <= *(int *)((long)hnd + 0x18)) {
      _mpp_log_l(2,"hal_task","Assertion %s failed at %s:%d\n",(char *)0x0,
                 "impl->index < group->task_count","hal_task_hnd_get_data",0xfb);
      if ((mpp_debug._3_1_ & 0x10) != 0) {
        abort();
      }
    }
    pvVar1 = *(void **)((long)hnd + 0x20);
  }
  return pvVar1;
}

Assistant:

void *hal_task_hnd_get_data(HalTaskHnd hnd)
{
    if (NULL == hnd) {
        mpp_err_f("found invaid input hnd %p\n", hnd);
        return NULL;
    }

    HalTaskImpl *impl = (HalTaskImpl *)hnd;
    HalTaskGroupImpl *group = impl->group;

    mpp_assert(impl->index < group->task_count);

    return impl->data;
}